

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

ReadFileResult __thiscall
cmCMakePresetsGraph::ReadProjectPresetsInternal(cmCMakePresetsGraph *this,bool allowNoFiles)

{
  pointer *pppFVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  bool bVar5;
  reference ppVar6;
  pointer ppVar7;
  size_type sVar8;
  iterator iVar9;
  iterator iVar10;
  vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
  *this_00;
  reference pWVar11;
  ReadFileResult local_1f4;
  ReadFileResult result_2;
  WorkflowStep *step;
  iterator __end2;
  iterator __begin2;
  vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
  *__range2;
  ConfigurePreset *configurePreset_3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>
  *it_4;
  iterator __end1_4;
  iterator __begin1_4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
  *__range1_4;
  bool local_191;
  _Self local_190;
  _Self local_188;
  iterator configurePreset_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>
  *it_3;
  iterator __end1_3;
  iterator __begin1_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
  *__range1_3;
  bool local_149;
  _Self local_148;
  _Self local_140;
  iterator configurePreset_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>
  *it_2;
  iterator __end1_2;
  iterator __begin1_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
  *__range1_2;
  bool local_101;
  _Self local_100;
  _Self local_f8;
  iterator configurePreset;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>
  *it_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
  *__range1_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>
  *it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
  *__range1;
  ReadFileResult _result_4;
  ReadFileResult _result_3;
  ReadFileResult _result_2;
  ReadFileResult _result_1;
  ReadFileResult _result;
  ReadFileResult result_1;
  undefined4 local_74;
  ReadFileResult local_70;
  ReadFileResult result;
  undefined1 local_60 [8];
  vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_> inProgressFiles;
  string filename;
  File *file;
  bool haveOneFile;
  bool allowNoFiles_local;
  cmCMakePresetsGraph *this_local;
  
  bVar5 = false;
  pppFVar1 = &inProgressFiles.
              super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  GetUserFilename((string *)pppFVar1,&this->SourceDir);
  std::vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>::vector
            ((vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_> *)
             local_60);
  bVar4 = cmsys::SystemTools::FileExists((string *)pppFVar1);
  if (bVar4) {
    local_70 = ReadJSONFile(this,(string *)
                                 &inProgressFiles.
                                  super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,User,Root,
                            (vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                             *)local_60,(File **)((long)&filename.field_2 + 8),&this->errors);
    this_local._4_4_ = local_70;
    if (local_70 != READ_OK) goto LAB_00540174;
    bVar5 = true;
  }
  else {
    GetFilename((string *)&_result,&this->SourceDir);
    pppFVar1 = &inProgressFiles.
                super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::operator=((string *)pppFVar1,(string *)&_result);
    std::__cxx11::string::~string((string *)&_result);
    bVar4 = cmsys::SystemTools::FileExists((string *)pppFVar1);
    if (bVar4) {
      this_local._4_4_ =
           ReadJSONFile(this,(string *)
                             &inProgressFiles.
                              super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,Project,Root,
                        (vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                         *)local_60,(File **)((long)&filename.field_2 + 8),&this->errors);
      if (this_local._4_4_ != READ_OK) goto LAB_00540174;
      bVar5 = true;
    }
  }
  bVar4 = std::vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>::
          empty((vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_> *
                )local_60);
  if (!bVar4) {
    __assert_fail("inProgressFiles.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx"
                  ,0x417,
                  "cmCMakePresetsGraph::ReadFileResult cmCMakePresetsGraph::ReadProjectPresetsInternal(bool)"
                 );
  }
  if (bVar5) {
    this_local._4_4_ =
         anon_unknown.dwarf_9eaba2::ComputePresetInheritance<cmCMakePresetsGraph::ConfigurePreset>
                   (&this->ConfigurePresets,this);
    if ((((this_local._4_4_ == READ_OK) &&
         (this_local._4_4_ =
               anon_unknown.dwarf_9eaba2::ComputePresetInheritance<cmCMakePresetsGraph::BuildPreset>
                         (&this->BuildPresets,this), this_local._4_4_ == READ_OK)) &&
        (this_local._4_4_ =
              anon_unknown.dwarf_9eaba2::ComputePresetInheritance<cmCMakePresetsGraph::TestPreset>
                        (&this->TestPresets,this), this_local._4_4_ == READ_OK)) &&
       ((this_local._4_4_ =
              anon_unknown.dwarf_9eaba2::
              ComputePresetInheritance<cmCMakePresetsGraph::PackagePreset>
                        (&this->PackagePresets,this), this_local._4_4_ == READ_OK &&
        (this_local._4_4_ =
              anon_unknown.dwarf_9eaba2::
              ComputePresetInheritance<cmCMakePresetsGraph::WorkflowPreset>
                        (&this->WorkflowPresets,this), this_local._4_4_ == READ_OK)))) {
      __end1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               ::begin(&this->ConfigurePresets);
      it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
              ::end(&this->ConfigurePresets);
      while (bVar5 = std::operator!=(&__end1,(_Self *)&it), bVar5) {
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                 ::operator*(&__end1);
        bVar5 = anon_unknown.dwarf_9eaba2::ExpandMacros<cmCMakePresetsGraph::ConfigurePreset>
                          (this,&(ppVar6->second).Unexpanded,&(ppVar6->second).Expanded);
        if (!bVar5) {
          this_local._4_4_ = INVALID_MACRO_EXPANSION;
          goto LAB_00540174;
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
        ::operator++(&__end1);
      }
      __end1_1 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                 ::begin(&this->BuildPresets);
      it_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                ::end(&this->BuildPresets);
      while (bVar5 = std::operator!=(&__end1_1,(_Self *)&it_1), bVar5) {
        configurePreset._M_node =
             (_Base_ptr)
             std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>
             ::operator*(&__end1_1);
        if (((((reference)configurePreset._M_node)->second).Unexpanded.super_Preset.Hidden & 1U) ==
            0) {
          local_f8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               ::find(&this->ConfigurePresets,
                      &(((reference)configurePreset._M_node)->second).Unexpanded.ConfigurePreset);
          local_100._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               ::end(&this->ConfigurePresets);
          bVar5 = std::operator==(&local_f8,&local_100);
          if (bVar5) {
            this_local._4_4_ = INVALID_CONFIGURE_PRESET;
            goto LAB_00540174;
          }
          p_Var2 = configurePreset._M_node[3]._M_parent;
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                   ::operator->(&local_f8);
          sVar8 = std::
                  unordered_set<cmCMakePresetsGraph::File_*,_std::hash<cmCMakePresetsGraph::File_*>,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::allocator<cmCMakePresetsGraph::File_*>_>
                  ::count((unordered_set<cmCMakePresetsGraph::File_*,_std::hash<cmCMakePresetsGraph::File_*>,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::allocator<cmCMakePresetsGraph::File_*>_>
                           *)&p_Var2[1]._M_parent,
                          &(ppVar7->second).Unexpanded.super_Preset.OriginFile);
          if (sVar8 == 0) {
            this_local._4_4_ = CONFIGURE_PRESET_UNREACHABLE_FROM_FILE;
            goto LAB_00540174;
          }
          local_101 = true;
          bVar5 = std::optional<bool>::value_or<bool>
                            ((optional<bool> *)&configurePreset._M_node[8]._M_right,&local_101);
          if (bVar5) {
            p_Var3 = configurePreset._M_node + 6;
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                     ::operator->(&local_f8);
            iVar9 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::begin(&(ppVar7->second).Unexpanded.super_Preset.Environment);
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                     ::operator->(&local_f8);
            iVar10 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::end(&(ppVar7->second).Unexpanded.super_Preset.Environment);
            std::
            map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
            ::
            insert<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                      ((map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                        *)&p_Var3->_M_parent,
                       (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar9._M_node,
                       (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar10._M_node);
          }
        }
        bVar5 = anon_unknown.dwarf_9eaba2::ExpandMacros<cmCMakePresetsGraph::BuildPreset>
                          (this,(BuildPreset *)(configurePreset._M_node + 1),
                           (optional<cmCMakePresetsGraph::BuildPreset> *)
                           &configurePreset._M_node[0xc]._M_parent);
        if (!bVar5) {
          this_local._4_4_ = INVALID_MACRO_EXPANSION;
          goto LAB_00540174;
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>
        ::operator++(&__end1_1);
      }
      __end1_2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
                 ::begin(&this->TestPresets);
      it_2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
                ::end(&this->TestPresets);
      while (bVar5 = std::operator!=(&__end1_2,(_Self *)&it_2), bVar5) {
        configurePreset_1._M_node =
             (_Base_ptr)
             std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>
             ::operator*(&__end1_2);
        if (((((reference)configurePreset_1._M_node)->second).Unexpanded.super_Preset.Hidden & 1U)
            == 0) {
          local_140._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               ::find(&this->ConfigurePresets,
                      &(((reference)configurePreset_1._M_node)->second).Unexpanded.ConfigurePreset);
          local_148._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               ::end(&this->ConfigurePresets);
          bVar5 = std::operator==(&local_140,&local_148);
          if (bVar5) {
            this_local._4_4_ = INVALID_CONFIGURE_PRESET;
            goto LAB_00540174;
          }
          p_Var2 = configurePreset_1._M_node[3]._M_parent;
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                   ::operator->(&local_140);
          sVar8 = std::
                  unordered_set<cmCMakePresetsGraph::File_*,_std::hash<cmCMakePresetsGraph::File_*>,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::allocator<cmCMakePresetsGraph::File_*>_>
                  ::count((unordered_set<cmCMakePresetsGraph::File_*,_std::hash<cmCMakePresetsGraph::File_*>,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::allocator<cmCMakePresetsGraph::File_*>_>
                           *)&p_Var2[1]._M_parent,
                          &(ppVar7->second).Unexpanded.super_Preset.OriginFile);
          if (sVar8 == 0) {
            this_local._4_4_ = CONFIGURE_PRESET_UNREACHABLE_FROM_FILE;
            goto LAB_00540174;
          }
          local_149 = true;
          bVar5 = std::optional<bool>::value_or<bool>
                            ((optional<bool> *)&configurePreset_1._M_node[8]._M_right,&local_149);
          if (bVar5) {
            p_Var3 = configurePreset_1._M_node + 6;
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                     ::operator->(&local_140);
            iVar9 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::begin(&(ppVar7->second).Unexpanded.super_Preset.Environment);
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                     ::operator->(&local_140);
            iVar10 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::end(&(ppVar7->second).Unexpanded.super_Preset.Environment);
            std::
            map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
            ::
            insert<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                      ((map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                        *)&p_Var3->_M_parent,
                       (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar9._M_node,
                       (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar10._M_node);
          }
        }
        bVar5 = anon_unknown.dwarf_9eaba2::ExpandMacros<cmCMakePresetsGraph::TestPreset>
                          (this,(TestPreset *)(configurePreset_1._M_node + 1),
                           (optional<cmCMakePresetsGraph::TestPreset> *)
                           &configurePreset_1._M_node[0x1d]._M_parent);
        if (!bVar5) {
          this_local._4_4_ = INVALID_MACRO_EXPANSION;
          goto LAB_00540174;
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>
        ::operator++(&__end1_2);
      }
      __end1_3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
                 ::begin(&this->PackagePresets);
      it_3 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
                ::end(&this->PackagePresets);
      while (bVar5 = std::operator!=(&__end1_3,(_Self *)&it_3), bVar5) {
        configurePreset_2._M_node =
             (_Base_ptr)
             std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>
             ::operator*(&__end1_3);
        if (((((reference)configurePreset_2._M_node)->second).Unexpanded.super_Preset.Hidden & 1U)
            == 0) {
          local_188._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               ::find(&this->ConfigurePresets,
                      &(((reference)configurePreset_2._M_node)->second).Unexpanded.ConfigurePreset);
          local_190._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               ::end(&this->ConfigurePresets);
          bVar5 = std::operator==(&local_188,&local_190);
          if (bVar5) {
            this_local._4_4_ = INVALID_CONFIGURE_PRESET;
            goto LAB_00540174;
          }
          p_Var2 = configurePreset_2._M_node[3]._M_parent;
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                   ::operator->(&local_188);
          sVar8 = std::
                  unordered_set<cmCMakePresetsGraph::File_*,_std::hash<cmCMakePresetsGraph::File_*>,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::allocator<cmCMakePresetsGraph::File_*>_>
                  ::count((unordered_set<cmCMakePresetsGraph::File_*,_std::hash<cmCMakePresetsGraph::File_*>,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::allocator<cmCMakePresetsGraph::File_*>_>
                           *)&p_Var2[1]._M_parent,
                          &(ppVar7->second).Unexpanded.super_Preset.OriginFile);
          if (sVar8 == 0) {
            this_local._4_4_ = CONFIGURE_PRESET_UNREACHABLE_FROM_FILE;
            goto LAB_00540174;
          }
          local_191 = true;
          bVar5 = std::optional<bool>::value_or<bool>
                            ((optional<bool> *)&configurePreset_2._M_node[8]._M_right,&local_191);
          if (bVar5) {
            p_Var3 = configurePreset_2._M_node + 6;
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                     ::operator->(&local_188);
            iVar9 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::begin(&(ppVar7->second).Unexpanded.super_Preset.Environment);
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                     ::operator->(&local_188);
            iVar10 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::end(&(ppVar7->second).Unexpanded.super_Preset.Environment);
            std::
            map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
            ::
            insert<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                      ((map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                        *)&p_Var3->_M_parent,
                       (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar9._M_node,
                       (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar10._M_node);
          }
        }
        bVar5 = anon_unknown.dwarf_9eaba2::ExpandMacros<cmCMakePresetsGraph::PackagePreset>
                          (this,(PackagePreset *)(configurePreset_2._M_node + 1),
                           (optional<cmCMakePresetsGraph::PackagePreset> *)
                           &configurePreset_2._M_node[0x11]._M_parent);
        if (!bVar5) {
          this_local._4_4_ = INVALID_MACRO_EXPANSION;
          goto LAB_00540174;
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>
        ::operator++(&__end1_3);
      }
      __end1_4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
                 ::begin(&this->WorkflowPresets);
      it_4 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
                ::end(&this->WorkflowPresets);
      while (bVar5 = std::operator!=(&__end1_4,(_Self *)&it_4), bVar5) {
        configurePreset_3 =
             (ConfigurePreset *)
             std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>
             ::operator*(&__end1_4);
        __range2 = (vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                    *)0x0;
        this_00 = &(((reference)configurePreset_3)->second).Unexpanded.Steps;
        __end2 = std::
                 vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                 ::begin(this_00);
        step = (WorkflowStep *)
               std::
               vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
               ::end(this_00);
        while (bVar5 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep_*,_std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>_>
                                           *)&step), bVar5) {
          pWVar11 = __gnu_cxx::
                    __normal_iterator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep_*,_std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>_>
                    ::operator*(&__end2);
          if ((__range2 ==
               (vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                *)0x0) && (pWVar11->PresetType != Configure)) {
            this_local._4_4_ = INVALID_WORKFLOW_STEPS;
            goto LAB_00540174;
          }
          if ((__range2 !=
               (vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                *)0x0) && (pWVar11->PresetType == Configure)) {
            this_local._4_4_ = INVALID_WORKFLOW_STEPS;
            goto LAB_00540174;
          }
          switch(pWVar11->PresetType) {
          case Configure:
            local_1f4 = anon_unknown.dwarf_9eaba2::
                        TryReachPresetFromWorkflow<cmCMakePresetsGraph::ConfigurePreset>
                                  ((WorkflowPreset *)
                                   ((long)&(configurePreset_3->super_Preset).Name.field_2 + 8),
                                   &this->ConfigurePresets,&pWVar11->PresetName,
                                   (ConfigurePreset **)&__range2);
            break;
          case Build:
            local_1f4 = anon_unknown.dwarf_9eaba2::
                        TryReachPresetFromWorkflow<cmCMakePresetsGraph::BuildPreset>
                                  ((WorkflowPreset *)
                                   ((long)&(configurePreset_3->super_Preset).Name.field_2 + 8),
                                   &this->BuildPresets,&pWVar11->PresetName,
                                   (ConfigurePreset **)&__range2);
            break;
          case Test:
            local_1f4 = anon_unknown.dwarf_9eaba2::
                        TryReachPresetFromWorkflow<cmCMakePresetsGraph::TestPreset>
                                  ((WorkflowPreset *)
                                   ((long)&(configurePreset_3->super_Preset).Name.field_2 + 8),
                                   &this->TestPresets,&pWVar11->PresetName,
                                   (ConfigurePreset **)&__range2);
            break;
          case Package:
            local_1f4 = anon_unknown.dwarf_9eaba2::
                        TryReachPresetFromWorkflow<cmCMakePresetsGraph::PackagePreset>
                                  ((WorkflowPreset *)
                                   ((long)&(configurePreset_3->super_Preset).Name.field_2 + 8),
                                   &this->PackagePresets,&pWVar11->PresetName,
                                   (ConfigurePreset **)&__range2);
          }
          if (local_1f4 != READ_OK) {
            this_local._4_4_ = local_1f4;
            goto LAB_00540174;
          }
          __gnu_cxx::
          __normal_iterator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep_*,_std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>_>
          ::operator++(&__end2);
        }
        if (__range2 ==
            (vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
             *)0x0) {
          this_local._4_4_ = INVALID_WORKFLOW_STEPS;
          goto LAB_00540174;
        }
        bVar5 = anon_unknown.dwarf_9eaba2::ExpandMacros<cmCMakePresetsGraph::WorkflowPreset>
                          (this,(WorkflowPreset *)
                                ((long)&(configurePreset_3->super_Preset).Name.field_2 + 8),
                           (optional<cmCMakePresetsGraph::WorkflowPreset> *)
                           ((long)&(configurePreset_3->Architecture).field_2 + 8));
        if (!bVar5) {
          this_local._4_4_ = INVALID_MACRO_EXPANSION;
          goto LAB_00540174;
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>
        ::operator++(&__end1_4);
      }
      this_local._4_4_ = READ_OK;
    }
  }
  else {
    this_local._4_4_ = (ReadFileResult)!allowNoFiles;
  }
LAB_00540174:
  local_74 = 1;
  std::vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>::~vector
            ((vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_> *)
             local_60);
  std::__cxx11::string::~string
            ((string *)
             &inProgressFiles.
              super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_local._4_4_;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult
cmCMakePresetsGraph::ReadProjectPresetsInternal(bool allowNoFiles)
{
  bool haveOneFile = false;

  File* file;
  std::string filename = GetUserFilename(this->SourceDir);
  std::vector<File*> inProgressFiles;
  if (cmSystemTools::FileExists(filename)) {
    auto result =
      this->ReadJSONFile(filename, RootType::User, ReadReason::Root,
                         inProgressFiles, file, this->errors);
    if (result != ReadFileResult::READ_OK) {
      return result;
    }
    haveOneFile = true;
  } else {
    filename = GetFilename(this->SourceDir);
    if (cmSystemTools::FileExists(filename)) {
      auto result =
        this->ReadJSONFile(filename, RootType::Project, ReadReason::Root,
                           inProgressFiles, file, this->errors);
      if (result != ReadFileResult::READ_OK) {
        return result;
      }
      haveOneFile = true;
    }
  }
  assert(inProgressFiles.empty());

  if (!haveOneFile) {
    return allowNoFiles ? ReadFileResult::READ_OK
                        : ReadFileResult::FILE_NOT_FOUND;
  }

  CHECK_OK(ComputePresetInheritance(this->ConfigurePresets, *this));
  CHECK_OK(ComputePresetInheritance(this->BuildPresets, *this));
  CHECK_OK(ComputePresetInheritance(this->TestPresets, *this));
  CHECK_OK(ComputePresetInheritance(this->PackagePresets, *this));
  CHECK_OK(ComputePresetInheritance(this->WorkflowPresets, *this));

  for (auto& it : this->ConfigurePresets) {
    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      return ReadFileResult::INVALID_MACRO_EXPANSION;
    }
  }

  for (auto& it : this->BuildPresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        return ReadFileResult::INVALID_CONFIGURE_PRESET;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        return ReadFileResult::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      return ReadFileResult::INVALID_MACRO_EXPANSION;
    }
  }

  for (auto& it : this->TestPresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        return ReadFileResult::INVALID_CONFIGURE_PRESET;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        return ReadFileResult::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      return ReadFileResult::INVALID_MACRO_EXPANSION;
    }
  }

  for (auto& it : this->PackagePresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        return ReadFileResult::INVALID_CONFIGURE_PRESET;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        return ReadFileResult::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      return ReadFileResult::INVALID_MACRO_EXPANSION;
    }
  }

  for (auto& it : this->WorkflowPresets) {
    using Type = WorkflowPreset::WorkflowStep::Type;

    const ConfigurePreset* configurePreset = nullptr;
    for (auto const& step : it.second.Unexpanded.Steps) {
      if (configurePreset == nullptr && step.PresetType != Type::Configure) {
        return ReadFileResult::INVALID_WORKFLOW_STEPS;
      }
      if (configurePreset != nullptr && step.PresetType == Type::Configure) {
        return ReadFileResult::INVALID_WORKFLOW_STEPS;
      }

      ReadFileResult result;
      switch (step.PresetType) {
        case Type::Configure:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->ConfigurePresets, step.PresetName,
            configurePreset);
          break;
        case Type::Build:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->BuildPresets, step.PresetName,
            configurePreset);
          break;
        case Type::Test:
          result =
            TryReachPresetFromWorkflow(it.second.Unexpanded, this->TestPresets,
                                       step.PresetName, configurePreset);
          break;
        case Type::Package:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->PackagePresets, step.PresetName,
            configurePreset);
          break;
      }
      if (result != ReadFileResult::READ_OK) {
        return result;
      }
    }

    if (configurePreset == nullptr) {
      return ReadFileResult::INVALID_WORKFLOW_STEPS;
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      return ReadFileResult::INVALID_MACRO_EXPANSION;
    }
  }

  return ReadFileResult::READ_OK;
}